

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void llvm::detail::anon_unknown_5::AdjustToPrecision
               (APInt *significand,int *exp,uint FormatPrecision)

{
  uint uVar1;
  uint uVar2;
  double __x;
  APInt local_68;
  APInt local_58;
  undefined1 local_48 [8];
  APInt powten;
  APInt divisor;
  uint tensRemovable;
  uint bitsRequired;
  uint bits;
  uint FormatPrecision_local;
  int *exp_local;
  APInt *significand_local;
  
  uVar1 = APInt::getActiveBits(significand);
  uVar2 = (FormatPrecision * 0xc4 + 0x3a) / 0x3b;
  if ((uVar2 < uVar1) && (divisor.BitWidth = ((uVar1 - uVar2) * 0x3b) / 0xc4, divisor.BitWidth != 0)
     ) {
    *exp = divisor.BitWidth + *exp;
    uVar1 = APInt::getBitWidth(significand);
    APInt::APInt((APInt *)&powten.BitWidth,uVar1,1,false);
    uVar1 = APInt::getBitWidth(significand);
    APInt::APInt((APInt *)local_48,uVar1,10,false);
    while( true ) {
      if ((divisor.BitWidth & 1) != 0) {
        APInt::operator*=((APInt *)&powten.BitWidth,(APInt *)local_48);
      }
      divisor.BitWidth = divisor.BitWidth >> 1;
      if (divisor.BitWidth == 0) break;
      APInt::operator*=((APInt *)local_48,(APInt *)local_48);
    }
    APInt::udiv(&local_58,significand);
    APInt::operator=(significand,&local_58);
    APInt::~APInt(&local_58);
    APInt::getActiveBits(significand);
    APInt::trunc(&local_68,__x);
    APInt::operator=(significand,&local_68);
    APInt::~APInt(&local_68);
    APInt::~APInt((APInt *)local_48);
    APInt::~APInt((APInt *)&powten.BitWidth);
  }
  return;
}

Assistant:

void AdjustToPrecision(APInt &significand,
                         int &exp, unsigned FormatPrecision) {
    unsigned bits = significand.getActiveBits();

    // 196/59 is a very slight overestimate of lg_2(10).
    unsigned bitsRequired = (FormatPrecision * 196 + 58) / 59;

    if (bits <= bitsRequired) return;

    unsigned tensRemovable = (bits - bitsRequired) * 59 / 196;
    if (!tensRemovable) return;

    exp += tensRemovable;

    APInt divisor(significand.getBitWidth(), 1);
    APInt powten(significand.getBitWidth(), 10);
    while (true) {
      if (tensRemovable & 1)
        divisor *= powten;
      tensRemovable >>= 1;
      if (!tensRemovable) break;
      powten *= powten;
    }

    significand = significand.udiv(divisor);

    // Truncate the significand down to its active bit count.
    significand = significand.trunc(significand.getActiveBits());
  }